

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastrender.h
# Opt level: O3

void __thiscall SQCompilation::RenderVisitor::visitDeclGroup(RenderVisitor *this,DeclGroup *grp)

{
  ulong uVar1;
  
  if ((grp->_decls)._size != 0) {
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        OutputStream::writeString(this->_out,", ");
      }
      Node::visit<SQCompilation::RenderVisitor>((Node *)(grp->_decls)._vals[uVar1],this);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (grp->_decls)._size);
  }
  return;
}

Assistant:

virtual void visitDeclGroup(DeclGroup *grp) {
        for (SQUnsignedInteger i = 0; i < grp->declarations().size(); ++i) {
            if (i) _out->writeString(", ");
            grp->declarations()[i]->visit(this);
        }
    }